

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_PrintBold
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined8 *puVar2;
  UCVarValue value;
  UCVarValue value_00;
  PClass *pPVar3;
  PClass *pPVar4;
  FFont *font;
  char *pcVar5;
  bool bVar6;
  FString text;
  FString formatted;
  FString local_50;
  FString local_48;
  float local_40;
  undefined4 uStack_3c;
  float local_34;
  double local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003d4414;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d4404:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d4414:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc64,
                  "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  puVar2 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar2 != (undefined8 *)0x0) {
      pPVar4 = (PClass *)puVar2[1];
      if (pPVar4 == (PClass *)0x0) {
        pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2);
        puVar2[1] = pPVar4;
      }
      bVar6 = pPVar4 != (PClass *)0x0;
      if (pPVar4 != pPVar3 && bVar6) {
        do {
          pPVar4 = pPVar4->ParentClass;
          bVar6 = pPVar4 != (PClass *)0x0;
          if (pPVar4 == pPVar3) break;
        } while (pPVar4 != (PClass *)0x0);
      }
      if (!bVar6) {
        pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003d4414;
      }
    }
  }
  else if (puVar2 != (undefined8 *)0x0) goto LAB_003d4404;
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_003d443c:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc65,
                  "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x02') {
    pcVar5 = "param[paramnum].Type == REGT_STRING";
    goto LAB_003d443c;
  }
  FString::AttachToOther(&local_50,(FString *)(param + 1));
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d4464;
    }
    local_30 = param[2].field_0.f;
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d4464:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc66,
                    "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    local_30 = param[2].field_0.f;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_003d4302;
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d4483;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_003d4302:
    iVar1 = param[3].field_0.i;
    local_34 = con_midtime.Value;
    if (*local_50.Chars == '$') {
      pcVar5 = FStringTable::operator()(&GStrings,local_50.Chars + 1);
      FString::operator=(&local_50,pcVar5);
    }
    if (iVar1 == 0) {
      font = (FFont *)0x0;
    }
    else {
      font = V_GetFont(FName::NameData.NameArray[iVar1].Text);
    }
    if (0.0 < local_30) {
      local_40 = (float)local_30;
      value._4_4_ = uStack_3c;
      value.Float = local_40;
      FBaseCVar::SetGenericRep(&con_midtime.super_FBaseCVar,value,CVAR_Float);
    }
    strbin1((char *)&local_48);
    if (font == (FFont *)0x0) {
      font = SmallFont;
    }
    C_MidPrintBold(font,local_48.Chars);
    local_40 = local_34;
    value_00._4_4_ = uStack_3c;
    value_00.Float = local_34;
    FBaseCVar::SetGenericRep(&con_midtime.super_FBaseCVar,value_00,CVAR_Float);
    FString::~FString(&local_48);
    FString::~FString(&local_50);
    return 0;
  }
  pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d4483:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xc67,
                "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PrintBold)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING	(text);
	PARAM_FLOAT_DEF	(time);
	PARAM_NAME_DEF	(fontname);

	float saved = con_midtime;
	FFont *font = NULL;
	
	if (text[0] == '$') text = GStrings(&text[1]);
	if (fontname != NAME_None)
	{
		font = V_GetFont(fontname);
	}
	if (time > 0)
	{
		con_midtime = float(time);
	}
	FString formatted = strbin1(text);
	C_MidPrintBold(font != NULL ? font : SmallFont, formatted.GetChars());
	con_midtime = saved;
	return 0;
}